

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O0

void InjectPayloadSleigh::checkParameterRestrictions
               (InjectContextSleigh *con,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *inputlist,
               vector<InjectParameter,_std::allocator<InjectParameter>_> *output,string *source)

{
  uint4 uVar1;
  size_type sVar2;
  size_type sVar3;
  LowlevelError *pLVar4;
  ulong uVar5;
  const_reference pvVar6;
  reference pvVar7;
  string local_d8 [36];
  uint4 local_b4;
  int local_b0;
  uint4 sz_1;
  int4 i_1;
  undefined1 local_81;
  string local_80 [32];
  uint4 local_60;
  int local_5c;
  uint4 sz;
  int4 i;
  string local_48 [32];
  string *local_28;
  string *source_local;
  vector<InjectParameter,_std::allocator<InjectParameter>_> *output_local;
  vector<InjectParameter,_std::allocator<InjectParameter>_> *inputlist_local;
  InjectContextSleigh *con_local;
  
  local_28 = source;
  source_local = (string *)output;
  output_local = inputlist;
  inputlist_local = (vector<InjectParameter,_std::allocator<InjectParameter>_> *)con;
  sVar2 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::size(inputlist);
  sVar3 = std::vector<VarnodeData,_std::allocator<VarnodeData>_>::size
                    ((vector<VarnodeData,_std::allocator<VarnodeData>_> *)
                     &inputlist_local[2].
                      super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar2 != sVar3) {
    sz._3_1_ = 1;
    pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::operator+((char *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Injection parameter list has different number of parameters than p-code operation: "
                  );
    LowlevelError::LowlevelError(pLVar4,local_48);
    sz._3_1_ = 0;
    __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  local_5c = 0;
  do {
    uVar5 = (ulong)local_5c;
    sVar2 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::size(output_local);
    if (sVar2 <= uVar5) {
      sVar2 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::size
                        ((vector<InjectParameter,_std::allocator<InjectParameter>_> *)source_local);
      sVar3 = std::vector<VarnodeData,_std::allocator<VarnodeData>_>::size
                        ((vector<VarnodeData,_std::allocator<VarnodeData>_> *)
                         &inputlist_local[3].
                          super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar2 != sVar3) {
        sz_1._3_1_ = 1;
        pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+((char *)&i_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Injection output does not match output of p-code operation: ");
        LowlevelError::LowlevelError(pLVar4,(string *)&i_1);
        sz_1._3_1_ = 0;
        __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      local_b0 = 0;
      do {
        uVar5 = (ulong)local_b0;
        sVar2 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::size
                          ((vector<InjectParameter,_std::allocator<InjectParameter>_> *)source_local
                          );
        if (sVar2 <= uVar5) {
          return;
        }
        pvVar6 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::operator[]
                           ((vector<InjectParameter,_std::allocator<InjectParameter>_> *)
                            source_local,(long)local_b0);
        uVar1 = InjectParameter::getSize(pvVar6);
        local_b4 = uVar1;
        if (uVar1 != 0) {
          pvVar7 = std::vector<VarnodeData,_std::allocator<VarnodeData>_>::operator[]
                             ((vector<VarnodeData,_std::allocator<VarnodeData>_> *)
                              &inputlist_local[3].
                               super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_b0);
          if (uVar1 != pvVar7->size) {
            pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
            std::operator+((char *)local_d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "P-code output size does not match injection specification: ");
            LowlevelError::LowlevelError(pLVar4,local_d8);
            __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
          }
        }
        local_b0 = local_b0 + 1;
      } while( true );
    }
    pvVar6 = std::vector<InjectParameter,_std::allocator<InjectParameter>_>::operator[]
                       (output_local,(long)local_5c);
    uVar1 = InjectParameter::getSize(pvVar6);
    local_60 = uVar1;
    if (uVar1 != 0) {
      pvVar7 = std::vector<VarnodeData,_std::allocator<VarnodeData>_>::operator[]
                         ((vector<VarnodeData,_std::allocator<VarnodeData>_> *)
                          &inputlist_local[2].
                           super__Vector_base<InjectParameter,_std::allocator<InjectParameter>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_5c);
      if (uVar1 != pvVar7->size) {
        local_81 = 1;
        pLVar4 = (LowlevelError *)__cxa_allocate_exception(0x20);
        std::operator+((char *)local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "P-code input parameter size does not match injection specification: ");
        LowlevelError::LowlevelError(pLVar4,local_80);
        local_81 = 0;
        __cxa_throw(pLVar4,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void InjectPayloadSleigh::checkParameterRestrictions(InjectContextSleigh &con,
						     const vector<InjectParameter> &inputlist,
						     const vector<InjectParameter> &output,
						     const string &source)
{ // Verify that the storage locations passed in -con- match the restrictions set for this payload
  if (inputlist.size() != con.inputlist.size())
    throw LowlevelError("Injection parameter list has different number of parameters than p-code operation: "+source);
  for(int4 i=0;i<inputlist.size();++i) {
    uint4 sz = inputlist[i].getSize();
    if ((sz != 0) && (sz != con.inputlist[i].size))
      throw LowlevelError("P-code input parameter size does not match injection specification: "+source);
  }
  if (output.size() != con.output.size())
    throw LowlevelError("Injection output does not match output of p-code operation: "+source);
  for(int4 i=0;i<output.size();++i) {
    uint4 sz = output[i].getSize();
    if ((sz != 0) && (sz != con.output[i].size))
      throw LowlevelError("P-code output size does not match injection specification: "+source);
  }
}